

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

Logger * __thiscall higan::Logger::operator<<(Logger *this,string *str)

{
  char *str_00;
  Logger *pLVar1;
  string *str_local;
  Logger *this_local;
  
  str_00 = (char *)std::__cxx11::string::c_str();
  pLVar1 = operator<<(this,str_00);
  return pLVar1;
}

Assistant:

Logger& Logger::operator<<(const std::string& str)
{
	return *this << str.c_str();
}